

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::SetWindingCount(Clipper *this,TEdge *edge)

{
  cInt cVar1;
  int iVar2;
  bool bVar3;
  int local_48;
  int local_44;
  PolyFillType local_40;
  TEdge *local_30;
  TEdge *e2;
  bool Inside;
  TEdge *pTStack_20;
  PolyFillType pft;
  TEdge *e;
  TEdge *edge_local;
  Clipper *this_local;
  
  pTStack_20 = edge->PrevInAEL;
  while( true ) {
    bVar3 = false;
    if ((pTStack_20 != (TEdge *)0x0) && (bVar3 = true, pTStack_20->PolyTyp == edge->PolyTyp)) {
      bVar3 = pTStack_20->WindDelta == 0;
    }
    if (!bVar3) break;
    pTStack_20 = pTStack_20->PrevInAEL;
  }
  if (pTStack_20 == (TEdge *)0x0) {
    if (edge->WindDelta == 0) {
      if (edge->PolyTyp == ptSubject) {
        local_40 = this->m_SubjFillType;
      }
      else {
        local_40 = this->m_ClipFillType;
      }
      iVar2 = 1;
      if (local_40 == pftNegative) {
        iVar2 = -1;
      }
      edge->WindCnt = iVar2;
    }
    else {
      edge->WindCnt = edge->WindDelta;
    }
    edge->WindCnt2 = 0;
    pTStack_20 = *(TEdge **)
                  (this->_vptr_Clipper[-3] + 0x10 +
                  (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>);
  }
  else if ((edge->WindDelta == 0) && (this->m_ClipType != ctUnion)) {
    edge->WindCnt = 1;
    edge->WindCnt2 = pTStack_20->WindCnt2;
    pTStack_20 = pTStack_20->NextInAEL;
  }
  else {
    bVar3 = IsEvenOddFillType(this,edge);
    if (bVar3) {
      if (edge->WindDelta == 0) {
        bVar3 = true;
        for (local_30 = pTStack_20->PrevInAEL; local_30 != (TEdge *)0x0;
            local_30 = local_30->PrevInAEL) {
          if ((local_30->PolyTyp == pTStack_20->PolyTyp) && (local_30->WindDelta != 0)) {
            bVar3 = (bool)(bVar3 ^ 1);
          }
        }
        edge->WindCnt = (uint)!bVar3;
      }
      else {
        edge->WindCnt = edge->WindDelta;
      }
      edge->WindCnt2 = pTStack_20->WindCnt2;
      pTStack_20 = pTStack_20->NextInAEL;
    }
    else {
      if (pTStack_20->WindCnt * pTStack_20->WindDelta < 0) {
        cVar1 = Abs((long)pTStack_20->WindCnt);
        if (cVar1 < 2) {
          if (edge->WindDelta == 0) {
            local_44 = 1;
          }
          else {
            local_44 = edge->WindDelta;
          }
          edge->WindCnt = local_44;
        }
        else if (pTStack_20->WindDelta * edge->WindDelta < 0) {
          edge->WindCnt = pTStack_20->WindCnt;
        }
        else {
          edge->WindCnt = pTStack_20->WindCnt + edge->WindDelta;
        }
      }
      else if (edge->WindDelta == 0) {
        if (pTStack_20->WindCnt < 0) {
          local_48 = pTStack_20->WindCnt + -1;
        }
        else {
          local_48 = pTStack_20->WindCnt + 1;
        }
        edge->WindCnt = local_48;
      }
      else if (pTStack_20->WindDelta * edge->WindDelta < 0) {
        edge->WindCnt = pTStack_20->WindCnt;
      }
      else {
        edge->WindCnt = pTStack_20->WindCnt + edge->WindDelta;
      }
      edge->WindCnt2 = pTStack_20->WindCnt2;
      pTStack_20 = pTStack_20->NextInAEL;
    }
  }
  bVar3 = IsEvenOddAltFillType(this,edge);
  if (bVar3) {
    for (; pTStack_20 != edge; pTStack_20 = pTStack_20->NextInAEL) {
      if (pTStack_20->WindDelta != 0) {
        edge->WindCnt2 = (uint)(edge->WindCnt2 == 0);
      }
    }
  }
  else {
    for (; pTStack_20 != edge; pTStack_20 = pTStack_20->NextInAEL) {
      edge->WindCnt2 = pTStack_20->WindDelta + edge->WindCnt2;
    }
  }
  return;
}

Assistant:

void Clipper::SetWindingCount(TEdge &edge)
{
  TEdge *e = edge.PrevInAEL;
  //find the edge of the same polytype that immediately preceeds 'edge' in AEL
  while (e  && ((e->PolyTyp != edge.PolyTyp) || (e->WindDelta == 0))) e = e->PrevInAEL;
  if (!e)
  {
    if (edge.WindDelta == 0)
    {
      PolyFillType pft = (edge.PolyTyp == ptSubject ? m_SubjFillType : m_ClipFillType);
      edge.WindCnt = (pft == pftNegative ? -1 : 1);
    }
    else
      edge.WindCnt = edge.WindDelta;
    edge.WindCnt2 = 0;
    e = m_ActiveEdges; //ie get ready to calc WindCnt2
  }   
  else if (edge.WindDelta == 0 && m_ClipType != ctUnion)
  {
    edge.WindCnt = 1;
    edge.WindCnt2 = e->WindCnt2;
    e = e->NextInAEL; //ie get ready to calc WindCnt2
  }
  else if (IsEvenOddFillType(edge))
  {
    //EvenOdd filling ...
    if (edge.WindDelta == 0)
    {
      //are we inside a subj polygon ...
      bool Inside = true;
      TEdge *e2 = e->PrevInAEL;
      while (e2)
      {
        if (e2->PolyTyp == e->PolyTyp && e2->WindDelta != 0) 
          Inside = !Inside;
        e2 = e2->PrevInAEL;
      }
      edge.WindCnt = (Inside ? 0 : 1);
    }
    else
    {
      edge.WindCnt = edge.WindDelta;
    }
    edge.WindCnt2 = e->WindCnt2;
    e = e->NextInAEL; //ie get ready to calc WindCnt2
  } 
  else
  {
    //nonZero, Positive or Negative filling ...
    if (e->WindCnt * e->WindDelta < 0)
    {
      //prev edge is 'decreasing' WindCount (WC) toward zero
      //so we're outside the previous polygon ...
      if (Abs(e->WindCnt) > 1)
      {
        //outside prev poly but still inside another.
        //when reversing direction of prev poly use the same WC 
        if (e->WindDelta * edge.WindDelta < 0) edge.WindCnt = e->WindCnt;
        //otherwise continue to 'decrease' WC ...
        else edge.WindCnt = e->WindCnt + edge.WindDelta;
      } 
      else
        //now outside all polys of same polytype so set own WC ...
        edge.WindCnt = (edge.WindDelta == 0 ? 1 : edge.WindDelta);
    } else
    {
      //prev edge is 'increasing' WindCount (WC) away from zero
      //so we're inside the previous polygon ...
      if (edge.WindDelta == 0) 
        edge.WindCnt = (e->WindCnt < 0 ? e->WindCnt - 1 : e->WindCnt + 1);
      //if wind direction is reversing prev then use same WC
      else if (e->WindDelta * edge.WindDelta < 0) edge.WindCnt = e->WindCnt;
      //otherwise add to WC ...
      else edge.WindCnt = e->WindCnt + edge.WindDelta;
    }
    edge.WindCnt2 = e->WindCnt2;
    e = e->NextInAEL; //ie get ready to calc WindCnt2
  }

  //update WindCnt2 ...
  if (IsEvenOddAltFillType(edge))
  {
    //EvenOdd filling ...
    while (e != &edge)
    {
      if (e->WindDelta != 0)
        edge.WindCnt2 = (edge.WindCnt2 == 0 ? 1 : 0);
      e = e->NextInAEL;
    }
  } else
  {
    //nonZero, Positive or Negative filling ...
    while ( e != &edge )
    {
      edge.WindCnt2 += e->WindDelta;
      e = e->NextInAEL;
    }
  }
}